

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

AWeapon * __thiscall FWeaponSlot::PickWeapon(FWeaponSlot *this,player_t *player,bool checkammo)

{
  PClassWeapon *pPVar1;
  AWeapon *pAVar2;
  PClass *pPVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AWeapon *pAVar6;
  undefined4 extraout_var_01;
  PClass *pPVar7;
  AWeapon *this_00;
  undefined4 extraout_var_02;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  
  if (player->mo == (APlayerPawn *)0x0) {
    this_00 = (AWeapon *)0x0;
  }
  else {
    this_00 = player->ReadyWeapon;
    if ((this->Weapons).Count != 0) {
      if ((this_00 != (AWeapon *)0x0) && ((this->Weapons).Count != 0)) {
        uVar8 = 0;
        do {
          pPVar1 = (this->Weapons).Array[uVar8].Type;
          pAVar6 = player->ReadyWeapon;
          if ((pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
              super_DObject.Class == (PClass *)0x0) {
            iVar5 = (**(pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                       super_DObject._vptr_DObject)(pAVar6);
            (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
            super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
          }
          if (pPVar1 == (PClassWeapon *)
                        (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                        super_DObject.Class) {
LAB_004af4e5:
            uVar9 = (uint)uVar8;
            if (uVar8 == 0) {
              uVar9 = (this->Weapons).Count;
            }
            while (uVar9 = uVar9 - 1, uVar8 != uVar9) {
              pAVar6 = (AWeapon *)
                       AActor::FindInventory
                                 (&player->mo->super_AActor,
                                  (PClassActor *)(this->Weapons).Array[(int)uVar9].Type,false);
              pPVar3 = AWeapon::RegistrationInfo.MyClass;
              if (pAVar6 == (AWeapon *)0x0) {
LAB_004af598:
                bVar10 = true;
                pAVar6 = this_00;
              }
              else {
                if ((pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                    super_DObject.Class == (PClass *)0x0) {
                  iVar5 = (**(pAVar6->super_AStateProvider).super_AInventory.super_AActor.
                             super_DThinker.super_DObject._vptr_DObject)(pAVar6);
                  (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                  super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar5);
                }
                pPVar7 = (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker
                         .super_DObject.Class;
                bVar10 = pPVar7 != (PClass *)0x0;
                if (pPVar7 != pPVar3 && bVar10) {
                  do {
                    pPVar7 = pPVar7->ParentClass;
                    bVar10 = pPVar7 != (PClass *)0x0;
                    if (pPVar7 == pPVar3) break;
                  } while (pPVar7 != (PClass *)0x0);
                }
                if (!bVar10) goto LAB_004af598;
                if (checkammo) {
                  bVar10 = false;
                  bVar4 = AWeapon::CheckAmmo(pAVar6,2,false,false,-1);
                  if (!bVar4) goto LAB_004af598;
                }
                else {
                  bVar10 = false;
                }
              }
              if (!bVar10) {
                return pAVar6;
              }
              this_00 = pAVar6;
              if (uVar9 == 0) {
                uVar9 = (this->Weapons).Count;
              }
            }
          }
          else {
            pAVar6 = player->ReadyWeapon;
            if ((((pAVar6->super_AStateProvider).super_AInventory.field_0x4fd & 4) != 0) &&
               (pAVar2 = (pAVar6->SisterWeapon).field_0.p, pAVar2 != (AWeapon *)0x0)) {
              if (((pAVar2->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject.ObjectFlags & 0x20) == 0) {
                pAVar6 = (player->ReadyWeapon->SisterWeapon).field_0.p;
                if ((pAVar6 != (AWeapon *)0x0) &&
                   (((pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                     super_DObject.ObjectFlags & 0x20) != 0)) {
                  (player->ReadyWeapon->SisterWeapon).field_0.p = (AWeapon *)0x0;
                  pAVar6 = (AWeapon *)0x0;
                }
                if ((pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                    super_DObject.Class == (PClass *)0x0) {
                  iVar5 = (**(pAVar6->super_AStateProvider).super_AInventory.super_AActor.
                             super_DThinker.super_DObject._vptr_DObject)(pAVar6);
                  (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                  super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar5);
                }
                if ((PClassWeapon *)
                    (pAVar6->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                    super_DObject.Class == (this->Weapons).Array[uVar8].Type) goto LAB_004af4e5;
              }
              else {
                (pAVar6->SisterWeapon).field_0.p = (AWeapon *)0x0;
              }
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (this->Weapons).Count);
      }
      uVar9 = (this->Weapons).Count;
      pAVar6 = this_00;
      do {
        uVar9 = uVar9 - 1;
        if ((int)uVar9 < 0) {
          return player->ReadyWeapon;
        }
        this_00 = (AWeapon *)
                  AActor::FindInventory
                            (&player->mo->super_AActor,
                             (PClassActor *)(this->Weapons).Array[uVar9 & 0x7fffffff].Type,false);
        pPVar3 = AWeapon::RegistrationInfo.MyClass;
        if (this_00 == (AWeapon *)0x0) {
LAB_004af68f:
          bVar10 = true;
          this_00 = pAVar6;
        }
        else {
          if ((this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
              super_DObject.Class == (PClass *)0x0) {
            iVar5 = (**(this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                       super_DObject._vptr_DObject)(this_00);
            (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
            super_DObject.Class = (PClass *)CONCAT44(extraout_var_02,iVar5);
          }
          pPVar7 = (this_00->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                   super_DObject.Class;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar3 && bVar10) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar10 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar3) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (!bVar10) goto LAB_004af68f;
          if (checkammo) {
            bVar10 = false;
            bVar4 = AWeapon::CheckAmmo(this_00,2,false,false,-1);
            if (!bVar4) goto LAB_004af68f;
          }
          else {
            bVar10 = false;
          }
        }
        pAVar6 = this_00;
      } while (bVar10);
    }
  }
  return this_00;
}

Assistant:

AWeapon *FWeaponSlot::PickWeapon(player_t *player, bool checkammo)
{
	int i, j;

	if (player->mo == NULL)
	{
		return NULL;
	}
	// Does this slot even have any weapons?
	if (Weapons.Size() == 0)
	{
		return player->ReadyWeapon;
	}
	if (player->ReadyWeapon != NULL)
	{
		for (i = 0; (unsigned)i < Weapons.Size(); i++)
		{
			if (Weapons[i].Type == player->ReadyWeapon->GetClass() ||
				(player->ReadyWeapon->WeaponFlags & WIF_POWERED_UP &&
				 player->ReadyWeapon->SisterWeapon != NULL &&
				 player->ReadyWeapon->SisterWeapon->GetClass() == Weapons[i].Type))
			{
				for (j = (i == 0 ? Weapons.Size() - 1 : i - 1);
					j != i;
					j = (j == 0 ? Weapons.Size() - 1 : j - 1))
				{
					AWeapon *weap = static_cast<AWeapon *> (player->mo->FindInventory(Weapons[j].Type));

					if (weap != NULL && weap->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						if (!checkammo || weap->CheckAmmo(AWeapon::EitherFire, false))
						{
							return weap;
						}
					}
				}
			}
		}
	}
	for (i = Weapons.Size() - 1; i >= 0; i--)
	{
		AWeapon *weap = static_cast<AWeapon *> (player->mo->FindInventory(Weapons[i].Type));

		if (weap != NULL && weap->IsKindOf(RUNTIME_CLASS(AWeapon)))
		{
			if (!checkammo || weap->CheckAmmo(AWeapon::EitherFire, false))
			{
				return weap;
			}
		}
	}
	return player->ReadyWeapon;
}